

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageDataOperations.h
# Opt level: O1

void fe::operations::
     applyOperationT<fe::operations::op_blit_colored,fe::PixelB8G8R8A8,fe::PixelB8G8R8A8>
               (op_blit_colored *op,PixelB8G8R8A8 *srcPixelFormat,PixelB8G8R8A8 *destPixelFormat,
               ImageData *src,ImageData *dest)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  uint8_t *puVar11;
  byte *pbVar12;
  int iVar13;
  uint8_t *puVar14;
  byte *pbVar15;
  
  bVar10 = check(src,dest);
  if ((bVar10) && (iVar7 = (dest->super_fe_image).h, iVar7 != 0)) {
    iVar8 = (dest->super_fe_image).w;
    puVar14 = (dest->super_fe_image).data;
    pbVar15 = (src->super_fe_image).data;
    iVar13 = 0;
    iVar9 = iVar8;
    pbVar12 = pbVar15;
    puVar11 = puVar14;
    do {
      for (; iVar9 != 0; iVar9 = iVar9 + -1) {
        bVar1 = pbVar15[1];
        bVar2 = *pbVar15;
        bVar3 = pbVar15[3];
        bVar4 = (op->color).field_0.field_0.bytes[1];
        bVar5 = (op->color).field_0.field_0.bytes[2];
        bVar6 = (op->color).field_0.field_0.bytes[3];
        puVar14[2] = (uint8_t)(((uint)(op->color).field_0.field_0.bytes[0] * (uint)pbVar15[2]) /
                              0xff);
        puVar14[1] = (uint8_t)(((uint)bVar4 * (uint)bVar1) / 0xff);
        *puVar14 = (uint8_t)(((uint)bVar5 * (uint)bVar2) / 0xff);
        puVar14[3] = (uint8_t)(((uint)bVar6 * (uint)bVar3) / 0xff);
        puVar14 = puVar14 + (dest->super_fe_image).bytespp;
        pbVar15 = pbVar15 + (src->super_fe_image).bytespp;
      }
      pbVar15 = pbVar12 + (src->super_fe_image).pitch;
      puVar14 = puVar11 + (dest->super_fe_image).pitch;
      iVar13 = iVar13 + 1;
      iVar9 = iVar8;
      pbVar12 = pbVar15;
      puVar11 = puVar14;
    } while (iVar13 != iVar7);
  }
  return;
}

Assistant:

void applyOperationT(const Op& op, const Src& srcPixelFormat, Dest& destPixelFormat, const ImageData& src, const ImageData& dest)
        {
            if (!check(src, dest))
                return;

            const unsigned char* srcBuffer = (unsigned char*)src.data;
            unsigned char* destBuffer = (unsigned char*)dest.data;

            int w = dest.w;
            int h = dest.h;

            for (int y = 0; y != h; ++y)
            {
                const unsigned char* srcLine = srcBuffer;
                unsigned char* destLine = destBuffer;

                for (int x = 0; x != w; ++x)
                {
                    op(srcPixelFormat, destPixelFormat, srcLine, destLine, x, y);

                    destLine += dest.bytespp;
                    srcLine += src.bytespp;
                }

                srcBuffer += src.pitch;
                destBuffer += dest.pitch;
            }
        }